

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDZFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  uchar *addr;
  string local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  size_t local_178;
  size_t max_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_138 [8];
  string _err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [7];
  bool ret;
  int local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  undefined1 local_c8 [8];
  string _err;
  undefined1 local_a8 [8];
  MMapFileHandle handle;
  string filepath;
  undefined1 local_50 [8];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  assets;
  USDLoadOptions *options_local;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *_filename_local;
  
  assets.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)options;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
            *)local_50);
  io::ExpandFilePath((string *)&handle.size,(string *)_filename,(void *)0x0);
  bVar1 = io::IsMMapSupported();
  if (bVar1) {
    io::MMapFileHandle::MMapFileHandle((MMapFileHandle *)local_a8);
    ::std::__cxx11::string::string((string *)local_c8);
    bVar1 = io::MMapFile((string *)&handle.size,(MMapFileHandle *)local_a8,false,(string *)local_c8)
    ;
    if (bVar1) {
      lVar2 = ::std::__cxx11::string::size();
      if ((lVar2 != 0) && (warn != (string *)0x0)) {
        ::std::operator+(local_110,local_c8);
        ::std::__cxx11::string::operator+=((string *)warn,(string *)local_110);
        ::std::__cxx11::string::~string((string *)local_110);
      }
      local_ec = 0;
    }
    else {
      if (err != (string *)0x0) {
        ::std::operator+(local_e8,local_c8);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_e8);
        ::std::__cxx11::string::~string((string *)local_e8);
      }
      _filename_local._7_1_ = 0;
      local_ec = 1;
    }
    ::std::__cxx11::string::~string((string *)local_c8);
    if (local_ec == 0) {
      _filename_local._7_1_ =
           LoadUSDZFromMemory((uint8_t *)handle._32_8_,(size_t)handle.addr,(string *)&handle.size,
                              stage,warn,err,
                              (USDLoadOptions *)
                              assets.
                              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::string((string *)local_138);
      io::UnmapFile((MMapFileHandle *)local_a8,(string *)local_138);
      lVar2 = ::std::__cxx11::string::size();
      if ((lVar2 != 0) && (warn != (string *)0x0)) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_138);
        ::std::__cxx11::string::operator+=
                  ((string *)warn,
                   (string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      ::std::__cxx11::string::~string((string *)local_138);
      local_ec = 1;
    }
    io::MMapFileHandle::~MMapFileHandle((MMapFileHandle *)local_a8);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    local_178 = (long)*(int *)((long)&((assets.
                                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>
                                      ).super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
                                      super__Tuple_impl<2UL,_unsigned_long>.
                                      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl + 4)
                << 0x14;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes,
                              (string *)err,(string *)&handle.size,local_178,(void *)0x0);
    if (bVar1) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      if (sVar3 < 0x76) {
        if (err != (string *)0x0) {
          ::std::operator+((char *)local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "File size too short. Looks like this file is not a USDZ : \"");
          ::std::operator+(local_198,(char *)local_1b8);
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_198);
          ::std::__cxx11::string::~string((string *)local_198);
          ::std::__cxx11::string::~string(local_1b8);
        }
        _filename_local._7_1_ = false;
      }
      else {
        addr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
        _filename_local._7_1_ =
             LoadUSDZFromMemory(addr,sVar3,(string *)&handle.size,stage,warn,err,
                                (USDLoadOptions *)
                                assets.
                                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      _filename_local._7_1_ = false;
    }
    local_ec = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
  }
  ::std::__cxx11::string::~string((string *)&handle.size);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
             *)local_50);
  return (bool)(_filename_local._7_1_ & 1);
}

Assistant:

bool LoadUSDZFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  // <filename, byte_begin, byte_end>
  std::vector<std::tuple<std::string, size_t, size_t>> assets;

  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);


  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDZFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      return false;
    }

    if (data.size() < (11 * 8) + 30) {  // 88 for USDC header, 30 for ZIP header
      // ???
      if (err) {
        (*err) += "File size too short. Looks like this file is not a USDZ : \"" +
                  filepath + "\"\n";
      }
      return false;
    }

    return LoadUSDZFromMemory(data.data(), data.size(), filepath, stage, warn,
                              err, options);
  }
}